

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

void __thiscall RandStrCatList::RandStrCatList(RandStrCatList *this,RandStrParser *p)

{
  int iVar1;
  wchar_t wVar2;
  RandStrParser *in_RSI;
  RandStrNode *in_RDI;
  bool bVar3;
  RandStrParser *in_stack_00000028;
  RandStrRepeat *in_stack_00000030;
  RandStrNode *in_stack_ffffffffffffffc0;
  
  RandStrNode::RandStrNode(in_RDI);
  in_RDI->_vptr_RandStrNode = (_func_int **)&PTR__RandStrCatList_0043fc10;
  while( true ) {
    iVar1 = RandStrParser::more(in_RSI);
    bVar3 = false;
    if (iVar1 != 0) {
      wVar2 = RandStrParser::getch((RandStrParser *)in_stack_ffffffffffffffc0);
      bVar3 = false;
      if (wVar2 != L')') {
        wVar2 = RandStrParser::getch((RandStrParser *)in_stack_ffffffffffffffc0);
        bVar3 = wVar2 != L'|';
      }
    }
    if (!bVar3) break;
    in_stack_ffffffffffffffc0 = (RandStrNode *)operator_new(0x28);
    RandStrRepeat::RandStrRepeat(in_stack_00000030,in_stack_00000028);
    RandStrNode::addChild(in_RDI,in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

RandStrCatList(RandStrParser *p)
    {
        /* 
         *   parse repeat groups until we reach the end of the string, the
         *   end of the alternative, or the end of the parenthesized group 
         */
        while (p->more() && p->getch() != ')' && p->getch() != '|')
            addChild(new RandStrRepeat(p));
    }